

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collections.cpp
# Opt level: O3

int Lodtalk::ByteString::stSplitVariableNames(InterpreterProxy *interpreter)

{
  int iVar1;
  undefined4 extraout_var;
  ProtoObject *this;
  undefined4 extraout_var_01;
  size_t sVar2;
  Oop OVar3;
  string local_48;
  undefined4 extraout_var_00;
  
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1a])();
  if (CONCAT44(extraout_var,iVar1) != 0) {
    iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
    return iVar1;
  }
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0xb])(interpreter);
  this = (ProtoObject *)CONCAT44(extraout_var_00,iVar1);
  iVar1 = (**interpreter->_vptr_InterpreterProxy)(interpreter);
  sVar2 = ProtoObject::getNumberOfElements(this);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<unsigned_char*>
            ((string *)&local_48,this + 1,&this[1].object_header_.field_0x0 + sVar2);
  OVar3 = splitVariableNames((VMContext *)CONCAT44(extraout_var_01,iVar1),&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0x17])(interpreter,OVar3.field_0);
  return iVar1;
}

Assistant:

int ByteString::stSplitVariableNames(InterpreterProxy *interpreter)
{
    if(interpreter->getArgumentCount() != 0)
        return interpreter->primitiveFailed();

    Oop self = interpreter->getReceiver();
    Oop result = splitVariableNames(interpreter->getContext(), reinterpret_cast<ByteString*> (self.pointer)->getString());
    return interpreter->returnOop(result);
}